

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParser.cpp
# Opt level: O1

char * ODDLParser::OpenDDLParser::parseBooleanLiteral(char *in,char *end,Value **boolean)

{
  byte bVar1;
  byte *pbVar2;
  int iVar3;
  Value *this;
  bool value;
  byte *pbVar4;
  byte *__s2;
  
  *boolean = (Value *)0x0;
  if (in == end || in == (char *)0x0) {
    return in;
  }
  do {
    pbVar2 = (byte *)in;
    pbVar4 = (byte *)in;
    __s2 = (byte *)in;
    if ((0x2c < (ulong)(byte)*in) ||
       (pbVar4 = (byte *)in, (0x100100002600U >> ((ulong)(byte)*in & 0x3f) & 1) == 0)) break;
    in = (char *)((byte *)in + 1);
    pbVar2 = (byte *)end;
    pbVar4 = (byte *)end;
    __s2 = (byte *)end;
  } while (in != end);
  do {
    if (pbVar2 == (byte *)end) {
LAB_0068ce09:
      iVar3 = strncmp("true",(char *)__s2,4);
      if (iVar3 == 0) {
        this = ValueAllocator::allocPrimData(ddl_bool,1);
        *boolean = this;
        value = true;
      }
      else {
        iVar3 = strncmp("false",(char *)__s2,5);
        if (iVar3 != 0) {
          *boolean = (Value *)0x0;
          return (char *)pbVar4;
        }
        this = ValueAllocator::allocPrimData(ddl_bool,1);
        *boolean = this;
        value = false;
      }
      Value::setBool(this,value);
      return (char *)pbVar4;
    }
    bVar1 = *pbVar2;
    pbVar4 = pbVar2;
    if ((((ulong)bVar1 < 0x2d) && ((0x130100000200U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) ||
       ((bVar1 - 0x5b < 0x23 && ((0x500000001U >> ((ulong)(bVar1 - 0x5b) & 0x3f) & 1) != 0))))
    goto LAB_0068ce09;
    pbVar2 = pbVar2 + 1;
    pbVar4 = (byte *)end;
  } while( true );
}

Assistant:

char *OpenDDLParser::parseBooleanLiteral( char *in, char *end, Value **boolean ) {
    *boolean = ddl_nullptr;
    if( ddl_nullptr == in || in == end ) {
        return in;
    }

    in = lookForNextToken( in, end );
    char *start( in );
    size_t len( 0 );
    while( !isSeparator( *in ) && in != end ) {
        ++in;
        ++len;
    }
    ++len;
    int res = ::strncmp( Grammar::BoolTrue, start, strlen( Grammar::BoolTrue ) );
    if( 0 != res ) {
        res = ::strncmp( Grammar::BoolFalse, start, strlen( Grammar::BoolFalse ) );
        if( 0 != res ) {
            *boolean = ddl_nullptr;
            return in;
        }
        *boolean = ValueAllocator::allocPrimData( Value::ddl_bool );
        (*boolean)->setBool( false );
    } else {
        *boolean = ValueAllocator::allocPrimData( Value::ddl_bool );
        (*boolean)->setBool( true );
    }

    return in;
}